

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTests.cpp
# Opt level: O3

void __thiscall
agge::tests::PathGeneratorAdapterTests::SubpathIsFullyPassedToGenerator
          (PathGeneratorAdapterTests *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined8 uVar3;
  FailedAssertion *this_00;
  long lVar4;
  undefined8 *puVar5;
  point *ppVar6;
  point reference2 [5];
  path_generator_adapter<agge::tests::mocks::path,_agge::tests::(anonymous_namespace)::passthrough_generator>
  pg;
  point reference1 [2];
  path p;
  point input [7];
  undefined1 local_1b8 [4];
  real_t arStack_1b4 [3];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  undefined8 uStack_198;
  real_t rStack_190;
  int local_18c;
  real_t rStack_188;
  undefined8 uStack_184;
  LocationInfo local_170;
  string local_148;
  passthrough_generator local_128;
  path_generator_adapter<agge::tests::mocks::path,_agge::tests::(anonymous_namespace)::passthrough_generator>
  local_100;
  point local_c8;
  undefined4 uStack_bc;
  undefined8 local_b8;
  void *local_a8 [3];
  size_t local_90;
  point local_88 [6];
  undefined4 local_38;
  
  puVar5 = &DAT_0019fee0;
  ppVar6 = local_88;
  for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
    uVar3 = *puVar5;
    ppVar6->x = (real_t)(int)uVar3;
    ppVar6->y = (real_t)(int)((ulong)uVar3 >> 0x20);
    puVar5 = puVar5 + 1;
    ppVar6 = (point *)&ppVar6->command;
  }
  local_38 = 2;
  std::vector<agge::tests::mocks::path::point,std::allocator<agge::tests::mocks::path::point>>::
  vector<agge::tests::mocks::path::point*>
            ((vector<agge::tests::mocks::path::point,std::allocator<agge::tests::mocks::path::point>>
              *)local_a8,local_88,(point *)&stack0xffffffffffffffcc,(allocator_type *)local_1b8);
  local_90 = 0;
  local_128.super_path.points.
  super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128.super_path.position = 0;
  local_128.super_path.points.
  super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.super_path.points.
  super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.kx = 1.0;
  local_128.ky = 1.0;
  std::vector<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>::
  vector((vector<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
          *)&local_100,
         (vector<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
          *)local_a8);
  local_100._source.position = local_90;
  local_100._generator = &local_128;
  local_100._state = 0;
  std::vector<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>::
  resize((vector<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
          *)local_100._generator,3,(value_type)ZEXT812(0));
  path_generator_adapter<agge::tests::mocks::path,_agge::tests::(anonymous_namespace)::passthrough_generator>
  ::vertex(&local_100,(real_t *)local_1b8,arStack_1b4);
  local_c8.x = 2.0;
  local_c8.y = 7.0;
  local_c8.command = 1;
  uStack_bc = 0x42146666;
  local_b8 = 0x2419d999a;
  paVar1 = &local_170.filename.field_2;
  local_170.filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_170,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/PathTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo((LocationInfo *)local_1b8,&local_170.filename,0xe2);
  ut::
  are_equal<agge::tests::mocks::path::point,2ul,std::vector<agge::tests::mocks::path::point,std::allocator<agge::tests::mocks::path::point>>>
            ((point (*) [2])&local_c8,
             (vector<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
              *)&local_128,(LocationInfo *)local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(arStack_1b4[0],local_1b8) != &local_1a8) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(arStack_1b4[0],local_1b8));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170.filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_170.filename._M_dataplus._M_p);
  }
  std::vector<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>::
  resize((vector<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
          *)&local_128,0x11,(value_type)ZEXT812(0));
  path_generator_adapter<agge::tests::mocks::path,_agge::tests::(anonymous_namespace)::passthrough_generator>
  ::vertex(&local_100,(real_t *)local_1b8,arStack_1b4);
  lVar4 = (long)local_128.super_path.points.
                super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_128.super_path.points.
                super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
                ._M_impl.super__Vector_impl_data._M_start;
  paVar2 = &local_148.field_2;
  local_148._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_148,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/PathTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo((LocationInfo *)local_1b8,&local_148,0xeb);
  if (lVar4 == 0xcc) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(arStack_1b4[0],local_1b8) != &local_1a8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(arStack_1b4[0],local_1b8));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != paVar2) {
      operator_delete(local_148._M_dataplus._M_p);
    }
    path_generator_adapter<agge::tests::mocks::path,_agge::tests::(anonymous_namespace)::passthrough_generator>
    ::vertex(&local_100,(real_t *)local_1b8,arStack_1b4);
    rStack_188 = 1.0;
    uStack_184._0_4_ = 17.0;
    uStack_184._4_4_ = 2;
    uStack_198._0_4_ = 2;
    uStack_198._4_4_ = 0x41300000;
    rStack_190 = 23.0;
    local_18c = 2;
    local_1a8._M_allocated_capacity = 0x240e9999a;
    local_1a8._8_8_ = 0x419d999a432b199a;
    local_1b8 = (undefined1  [4])0x41300000;
    arStack_1b4[0] = 23.0;
    arStack_1b4[1] = 1.4013e-45;
    arStack_1b4[2] = 2.3;
    local_148._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_148,
               "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/PathTests.cpp"
               ,"");
    ut::LocationInfo::LocationInfo(&local_170,&local_148,0xf9);
    ut::
    are_equal<agge::tests::mocks::path::point,5ul,std::vector<agge::tests::mocks::path::point,std::allocator<agge::tests::mocks::path::point>>>
              ((point (*) [5])local_1b8,
               (vector<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
                *)&local_128,&local_170);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170.filename._M_dataplus._M_p != paVar1) {
      operator_delete(local_170.filename._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != paVar2) {
      operator_delete(local_148._M_dataplus._M_p);
    }
    if (local_100._source.points.
        super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_100._source.points.
                      super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_128.super_path.points.
        super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_128.super_path.points.
                      super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_a8[0] != (void *)0x0) {
      operator_delete(local_a8[0]);
    }
    return;
  }
  this_00 = (FailedAssertion *)__cxa_allocate_exception(0x38);
  local_170.filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"Values are not equal!","");
  ut::FailedAssertion::FailedAssertion(this_00,&local_170.filename,(LocationInfo *)local_1b8);
  __cxa_throw(this_00,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
}

Assistant:

test( SubpathIsFullyPassedToGenerator )
			{
				// INIT
				mocks::path::point input[] = {
					{ 2.0f, 7.0f, path_command_move_to },
					{ 37.1f, 19.7f, path_command_line_to },
					{ 11.0f, 23.0f, path_command_move_to },
					{ 2.3f, 7.3f, path_command_line_to },
					{ 171.1f, 19.7f, path_command_line_to },
					{ 11.0f, 23.0f, path_command_line_to },
					{ 1.0f, 17.0f, path_command_line_to },
				};
				mocks::path p(input);
				passthrough_generator g;
				path_generator_adapter<mocks::path, passthrough_generator> pg = assist(p, g);

				g.points.resize(3); // Resize to check if its cleared.

				// ACT
				vertex(pg);

				// ASSERT
				mocks::path::point reference1[] = {
					{ 2.0f, 7.0f, path_command_move_to },
					{ 37.1f, 19.7f, path_command_line_to },
				};

				assert_equal(reference1, g.points);

				// INIT
				g.points.resize(17);

				// ACT
				vertex(pg);

				// ASSERT
				assert_equal(17u, g.points.size()); // no change

				// ACT (new subpath)
				vertex(pg);

				// ASSERT
				mocks::path::point reference2[] = {
					{ 11.0f, 23.0f, path_command_move_to },
					{ 2.3f, 7.3f, path_command_line_to },
					{ 171.1f, 19.7f, path_command_line_to },
					{ 11.0f, 23.0f, path_command_line_to },
					{ 1.0f, 17.0f, path_command_line_to },
				};

				assert_equal(reference2, g.points);
			}